

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O0

void __thiscall
cppgenerate::Constructor::printSignature
          (Constructor *this,Class *parent,ostream *stream,bool withAccessModifier)

{
  AccessModifier AVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined1 local_48 [47];
  bool withAccessModifier_local;
  ostream *stream_local;
  Class *parent_local;
  Constructor *this_local;
  
  local_48[0x27] = withAccessModifier;
  unique0x100001e9 = stream;
  stream_local = (ostream *)parent;
  parent_local = (Class *)this;
  if (withAccessModifier) {
    AVar1 = this->m_accessModifier;
    if (AVar1 == PUBLIC) {
      poVar3 = std::operator<<(stream,"public:");
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    }
    else if (AVar1 == PRIVATE) {
      poVar3 = std::operator<<(stream,"private:");
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    }
    else if (AVar1 == PROTECTED) {
      poVar3 = std::operator<<(stream,"protected:");
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  uVar2 = std::__cxx11::string::length();
  if (1 < uVar2) {
    poVar3 = std::operator<<(stack0xffffffffffffffe0,"/** ");
    poVar3 = std::operator<<(poVar3,(string *)this);
    poVar3 = std::operator<<(poVar3," */");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = stack0xffffffffffffffe0;
  Class::getName_abi_cxx11_((Class *)local_48);
  printConstructorSignature(this,poVar3,(string *)local_48,false);
  std::__cxx11::string::~string((string *)local_48);
  poVar3 = std::operator<<(stack0xffffffffffffffe0,";");
  std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Constructor::printSignature( const cppgenerate::Class* parent, std::ostream& stream, bool withAccessModifier ) const {
    if( withAccessModifier ){
        switch( m_accessModifier ){
            case AccessModifier::PUBLIC:
                stream << "public:" << std::endl;
                break;
            case AccessModifier::PRIVATE:
                stream << "private:" << std::endl;
                break;
            case AccessModifier::PROTECTED:
                stream << "protected:" << std::endl;
                break;
        }
    }

    if( m_documentation.length() > 1 ){
        stream << "/** " << m_documentation << " */" << std::endl;
    }

    printConstructorSignature( stream, parent->getName(), false );

    stream << ";" << std::endl;
}